

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

uint GetAllocaAddress(InstructionVMEvalContext *ctx,VariableData *container)

{
  StackFrame *pSVar1;
  StackFrame **ppSVar2;
  VariableData **ppVVar3;
  uint uVar4;
  uint i;
  uint index;
  
  ppSVar2 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar2;
  uVar4 = 8;
  index = 0;
  while( true ) {
    if ((pSVar1->owner->allocas).count <= index) {
      return 0;
    }
    ppVVar3 = SmallArray<VariableData_*,_4U>::operator[](&pSVar1->owner->allocas,index);
    if (*ppVVar3 == container) break;
    uVar4 = uVar4 + (int)(*ppVVar3)->type->size;
    index = index + 1;
  }
  return uVar4;
}

Assistant:

unsigned GetAllocaAddress(InstructionVMEvalContext &ctx, VariableData *container)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	unsigned offset = 8;

	for(unsigned i = 0; i < frame->owner->allocas.size(); i++)
	{
		VariableData *data = frame->owner->allocas[i];

		if(container == data)
			return offset;

		offset += unsigned(data->type->size);
	}

	return 0;
}